

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

void __thiscall
duckdb::ModeState<int,_duckdb::ModeStandard<int>_>::InitializePage
          (ModeState<int,_duckdb::ModeStandard<int>_> *this,WindowPartitionInput *partition)

{
  void *__s;
  idx_t iVar1;
  pointer in_RSI;
  long in_RDI;
  DataChunk *in_stack_00000010;
  ColumnDataScanState *in_stack_00000018;
  ColumnDataCollection *in_stack_00000020;
  undefined7 in_stack_ffffffffffffff98;
  ColumnDataScanProperties in_stack_ffffffffffffff9f;
  ColumnDataScanState *in_stack_ffffffffffffffa0;
  vector<unsigned_long,_true> *this_00;
  ColumnDataScanState *state;
  ColumnDataCollection *this_01;
  pointer local_10;
  
  local_10 = in_RSI;
  if (*(long *)(in_RDI + 0x48) == 0) {
    __s = operator_new(0x80);
    memset(__s,0,0x80);
    ColumnDataScanState::ColumnDataScanState(in_stack_ffffffffffffffa0);
    *(void **)(in_RDI + 0x48) = __s;
  }
  iVar1 = DataChunk::ColumnCount((DataChunk *)0x1dfc293);
  if (iVar1 == 0) {
    *(element_type **)(in_RDI + 0x40) =
         (local_10->type_info_).internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = *(vector<unsigned_long,_true> **)(in_RDI + 0x40);
    state = *(ColumnDataScanState **)(in_RDI + 0x48);
    this_01 = (ColumnDataCollection *)&stack0xffffffffffffffd8;
    vector<unsigned_long,_true>::vector
              (this_00,(vector<unsigned_long,_true> *)
                       CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    ColumnDataCollection::InitializeScan(this_01,state,this_00,in_stack_ffffffffffffff9f);
    vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0x1dfc2fe);
    ColumnDataCollection::InitializeScanChunk(in_stack_00000020,in_stack_00000018,in_stack_00000010)
    ;
  }
  return;
}

Assistant:

void InitializePage(const WindowPartitionInput &partition) {
		if (!scan) {
			scan = new ColumnDataScanState();
		}
		if (page.ColumnCount() == 0) {
			D_ASSERT(partition.inputs);
			inputs = partition.inputs;
			D_ASSERT(partition.column_ids.size() == 1);
			inputs->InitializeScan(*scan, partition.column_ids);
			inputs->InitializeScanChunk(*scan, page);
		}
	}